

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

void __thiscall soul::StructuralParser::parseSpecialisationParameters(StructuralParser *this)

{
  bool bVar1;
  uint uVar2;
  VariableDeclaration *pVVar3;
  Expression *pEVar4;
  ModuleBase *pMVar5;
  pool_ptr<soul::AST::Expression> local_1f0;
  char *local_1e8;
  string *local_1e0;
  bool local_1d1;
  void *local_1d0;
  Context local_1c8;
  VariableDeclaration *local_1b0;
  VariableDeclaration *parameterVariable;
  Expression *parameterType;
  char *local_198;
  Identifier local_190;
  NamespaceAliasDeclaration *local_188;
  NamespaceAliasDeclaration *namespaceAliasDeclaration;
  Context context_2;
  pool_ptr<soul::AST::Expression> local_128;
  char *local_120;
  Identifier local_118;
  ProcessorAliasDeclaration *local_110;
  ProcessorAliasDeclaration *processorAliasDeclaration;
  Context context_1;
  pool_ptr<soul::AST::Expression> local_b0;
  char *local_a8;
  void *local_a0;
  UsingDeclaration *local_98;
  UsingDeclaration *usingDeclaration;
  Identifier name;
  Context context;
  CompileMessage local_60;
  char *local_28;
  char *local_20;
  char *local_18;
  StructuralParser *local_10;
  StructuralParser *this_local;
  
  local_18 = "(";
  local_10 = this;
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x573c42);
  if (bVar1) {
    local_20 = ")";
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x571824);
    if (!bVar1) {
      do {
        local_28 = "using";
        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)"using");
        if (bVar1) {
          pMVar5 = pool_ptr<soul::AST::ModuleBase>::operator->(&this->module);
          uVar2 = (*(pMVar5->super_ASTObject)._vptr_ASTObject[5])();
          if ((uVar2 & 1) != 0) {
            Errors::graphCannotHaveSpecialisations<>();
            (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_60);
            CompileMessage::~CompileMessage(&local_60);
          }
          getContext((Context *)&name,this);
          usingDeclaration = (UsingDeclaration *)parseIdentifier(this);
          local_a0 = (void *)0x0;
          local_98 = allocate<soul::AST::UsingDeclaration,soul::AST::Context&,soul::Identifier&,decltype(nullptr)>
                               (this,(Context *)&name,(Identifier *)&usingDeclaration,&local_a0);
          local_a8 = "=";
          bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x54e52c);
          if (bVar1) {
            pEVar4 = parseType(this,variableType);
            pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>(&local_b0,pEVar4);
            (local_98->targetType).object = local_b0.object;
            pool_ptr<soul::AST::Expression>::~pool_ptr(&local_b0);
          }
          pMVar5 = pool_ptr<soul::AST::ModuleBase>::operator->(&this->module);
          (*(pMVar5->super_ASTObject)._vptr_ASTObject[0x11])(pMVar5,local_98);
          AST::Context::~Context((Context *)&name);
        }
        else {
          bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x570035);
          if (bVar1) {
            pMVar5 = pool_ptr<soul::AST::ModuleBase>::operator->(&this->module);
            uVar2 = (*(pMVar5->super_ASTObject)._vptr_ASTObject[5])();
            if ((uVar2 & 1) == 0) {
              Errors::processorSpecialisationNotAllowed<>();
              (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&context_1.parentScope);
              CompileMessage::~CompileMessage((CompileMessage *)&context_1.parentScope);
            }
            getContext((Context *)&processorAliasDeclaration,this);
            local_118 = parseIdentifier(this);
            local_110 = allocate<soul::AST::ProcessorAliasDeclaration,soul::AST::Context&,soul::Identifier>
                                  (this,(Context *)&processorAliasDeclaration,&local_118);
            local_120 = "=";
            bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                    ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x54e52c);
            if (bVar1) {
              pEVar4 = parseType(this,nameOrType);
              pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>
                        (&local_128,pEVar4);
              (local_110->targetProcessor).object = local_128.object;
              pool_ptr<soul::AST::Expression>::~pool_ptr(&local_128);
            }
            pMVar5 = pool_ptr<soul::AST::ModuleBase>::operator->(&this->module);
            (*(pMVar5->super_ASTObject)._vptr_ASTObject[0x12])(pMVar5,local_110);
            AST::Context::~Context((Context *)&processorAliasDeclaration);
          }
          else {
            bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                    ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x56fab0);
            if (bVar1) {
              pMVar5 = pool_ptr<soul::AST::ModuleBase>::operator->(&this->module);
              uVar2 = (*(pMVar5->super_ASTObject)._vptr_ASTObject[6])();
              if ((uVar2 & 1) == 0) {
                Errors::namespaceSpecialisationNotAllowed<>();
                (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&context_2.parentScope);
                CompileMessage::~CompileMessage((CompileMessage *)&context_2.parentScope);
              }
              getContext((Context *)&namespaceAliasDeclaration,this);
              local_190 = parseIdentifier(this);
              local_188 = allocate<soul::AST::NamespaceAliasDeclaration,soul::AST::Context&,soul::Identifier>
                                    (this,(Context *)&namespaceAliasDeclaration,&local_190);
              local_198 = "=";
              bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x54e52c);
              if (bVar1) {
                pEVar4 = parseType(this,nameOrType);
                pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>
                          ((pool_ptr<soul::AST::Expression> *)&parameterType,pEVar4);
                (local_188->targetNamespace).object = parameterType;
                pool_ptr<soul::AST::Expression>::~pool_ptr
                          ((pool_ptr<soul::AST::Expression> *)&parameterType);
              }
              pMVar5 = pool_ptr<soul::AST::ModuleBase>::operator->(&this->module);
              (*(pMVar5->super_ASTObject)._vptr_ASTObject[0x13])(pMVar5,local_188);
              AST::Context::~Context((Context *)&namespaceAliasDeclaration);
            }
            else {
              giveErrorOnExternalKeyword(this);
              parameterVariable = (VariableDeclaration *)parseType(this,processorParameter);
              getContext(&local_1c8,this);
              local_1d0 = (void *)0x0;
              local_1d1 = true;
              pVVar3 = allocate<soul::AST::VariableDeclaration,soul::AST::Context,soul::AST::Expression&,decltype(nullptr),bool>
                                 (this,&local_1c8,(Expression *)parameterVariable,&local_1d0,
                                  &local_1d1);
              AST::Context::~Context(&local_1c8);
              pVVar3->isSpecialisation = true;
              local_1b0 = pVVar3;
              local_1e0 = (string *)parseIdentifier(this);
              (local_1b0->name).name = local_1e0;
              local_1e8 = "=";
              bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x54e52c);
              if (bVar1) {
                pEVar4 = parseExpression(this,false);
                pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>
                          (&local_1f0,pEVar4);
                (local_1b0->initialValue).object = local_1f0.object;
                pool_ptr<soul::AST::Expression>::~pool_ptr(&local_1f0);
              }
              pMVar5 = pool_ptr<soul::AST::ModuleBase>::operator->(&this->module);
              (*(pMVar5->super_ASTObject)._vptr_ASTObject[0x10])(pMVar5,local_1b0);
            }
          }
        }
        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)",");
      } while (bVar1);
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x571824);
    }
  }
  return;
}

Assistant:

void parseSpecialisationParameters()
    {
        if (matchIf (Operator::openParen))
        {
            if (matchIf (Operator::closeParen))
                return;

            do
            {
                if (matchIf (Keyword::using_))
                {
                    if (module->isGraph())
                        throwError (Errors::graphCannotHaveSpecialisations());

                    auto context = getContext();
                    auto name = parseIdentifier();

                    auto& usingDeclaration = allocate<AST::UsingDeclaration> (context, name, nullptr);

                    if (matchIf (Operator::assign))
                        usingDeclaration.targetType = parseType (ParseTypeContext::variableType);

                    module->addSpecialisationParameter (usingDeclaration);
                }
                else if (matchIf (Keyword::processor))
                {
                    if (! module->isGraph())
                        throwError (Errors::processorSpecialisationNotAllowed());

                    auto context = getContext();
                    auto& processorAliasDeclaration = allocate<AST::ProcessorAliasDeclaration> (context, parseIdentifier());

                    if (matchIf (Operator::assign))
                        processorAliasDeclaration.targetProcessor = parseType (ParseTypeContext::nameOrType);

                    module->addSpecialisationParameter (processorAliasDeclaration);
                }
                else if (matchIf (Keyword::namespace_))
                {
                    if (! module->isNamespace())
                        throwError (Errors::namespaceSpecialisationNotAllowed());

                    auto context = getContext();
                    auto& namespaceAliasDeclaration = allocate<AST::NamespaceAliasDeclaration> (context, parseIdentifier());

                    if (matchIf (Operator::assign))
                        namespaceAliasDeclaration.targetNamespace = parseType (ParseTypeContext::nameOrType);

                    module->addSpecialisationParameter (namespaceAliasDeclaration);
                }
                else
                {
                    giveErrorOnExternalKeyword();
                    auto& parameterType = parseType (ParseTypeContext::processorParameter);
                    auto& parameterVariable = allocate<AST::VariableDeclaration> (getContext(), parameterType, nullptr, true);
                    parameterVariable.isSpecialisation = true;
                    parameterVariable.name = parseIdentifier();

                    if (matchIf (Operator::assign))
                        parameterVariable.initialValue = parseExpression();

                    module->addSpecialisationParameter (parameterVariable);
                }
            }
            while (matchIf (Operator::comma));

            expect (Operator::closeParen);
        }
    }